

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_left_predictor_16x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  ushort uVar14;
  ushort uVar16;
  ushort uVar17;
  undefined1 auVar11 [16];
  ushort uVar18;
  undefined1 auVar12 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 uVar13;
  byte bVar15;
  
  auVar11 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar19 = psadbw(*(undefined1 (*) [16])(left + 0x10),(undefined1  [16])0x0);
  auVar20 = psadbw(*(undefined1 (*) [16])(left + 0x20),(undefined1  [16])0x0);
  auVar8 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(left + 0x30));
  auVar9._0_2_ = auVar8._0_2_ + auVar20._0_2_ + auVar19._0_2_ + auVar11._0_2_;
  auVar9._2_2_ = auVar8._2_2_ + auVar20._2_2_ + auVar19._2_2_ + auVar11._2_2_;
  auVar9._4_2_ = auVar8._4_2_ + auVar20._4_2_ + auVar19._4_2_ + auVar11._4_2_;
  auVar9._6_2_ = auVar8._6_2_ + auVar20._6_2_ + auVar19._6_2_ + auVar11._6_2_;
  auVar9._8_2_ = auVar8._8_2_ + auVar20._8_2_ + auVar19._8_2_ + auVar11._8_2_;
  auVar9._10_2_ = auVar8._10_2_ + auVar20._10_2_ + auVar19._10_2_ + auVar11._10_2_;
  auVar9._12_2_ = auVar8._12_2_ + auVar20._12_2_ + auVar19._12_2_ + auVar11._12_2_;
  auVar9._14_2_ = auVar8._14_2_ + auVar20._14_2_ + auVar19._14_2_ + auVar11._14_2_;
  uVar10 = auVar9._8_2_ + auVar9._0_2_ + 0x20;
  uVar14 = auVar9._10_2_ + auVar9._2_2_ + 0x20;
  uVar16 = auVar9._12_2_ + auVar9._4_2_ + 0x20;
  uVar17 = auVar9._14_2_ + auVar9._6_2_ + 0x20;
  auVar11._0_2_ = uVar10 >> 6;
  uVar18 = uVar17 >> 6;
  uVar1 = CONCAT22((ushort)(auVar9._8_2_ * 2 + 0x20U) >> 6,uVar18);
  auVar19._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar9._10_2_ * 2 + 0x20U) >> 6,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar20._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar9._12_2_ * 2 + 0x20U) >> 6,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar12._0_13_ = auVar5 << 0x30;
  bVar15 = (byte)(uVar17 >> 8);
  auVar12._14_2_ = (undefined2)(CONCAT19(bVar15 >> 6,CONCAT18(bVar15 >> 6,uVar3)) >> 0x40);
  auVar12[0xd] = (char)uVar18;
  bVar15 = (byte)(uVar16 >> 0xe);
  auVar20._12_4_ = (undefined4)(CONCAT37(auVar12._13_3_,CONCAT16((char)uVar18,uVar2)) >> 0x30);
  auVar20[0xb] = bVar15;
  uVar13 = (undefined1)(uVar16 >> 6);
  auVar19._10_6_ = (undefined6)(CONCAT55(auVar20._11_5_,CONCAT14(bVar15,uVar1)) >> 0x20);
  auVar19[9] = uVar13;
  bVar15 = (byte)(uVar14 >> 0xe);
  auVar11._8_8_ = (undefined8)(CONCAT73(auVar19._9_7_,CONCAT12(uVar13,uVar18)) >> 0x10);
  auVar11[7] = bVar15;
  auVar11[6] = bVar15;
  uVar13 = (undefined1)(uVar14 >> 6);
  auVar11[5] = uVar13;
  auVar11[4] = uVar13;
  bVar15 = (byte)(uVar10 >> 8);
  auVar11[3] = bVar15 >> 6;
  auVar11[2] = bVar15 >> 6;
  auVar8[0] = (undefined1)auVar11._0_2_;
  auVar8._2_14_ = auVar11._2_14_;
  auVar8[1] = auVar8[0];
  auVar8 = pshuflw(auVar9,auVar8,0);
  uVar7 = auVar8._0_4_;
  iVar6 = 0x40;
  do {
    *(undefined4 *)dst = uVar7;
    *(undefined4 *)(dst + 4) = uVar7;
    *(undefined4 *)(dst + 8) = uVar7;
    *(undefined4 *)(dst + 0xc) = uVar7;
    dst = dst + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_64(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  __m128i x2 = _mm_load_si128((__m128i const *)(ref + 32));
  __m128i x3 = _mm_load_si128((__m128i const *)(ref + 48));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x2 = _mm_sad_epu8(x2, zero);
  x3 = _mm_sad_epu8(x3, zero);
  x0 = _mm_add_epi16(x0, x1);
  x2 = _mm_add_epi16(x2, x3);
  x0 = _mm_add_epi16(x0, x2);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}